

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O0

bool ft::
     equal<ft::constTreeIterator<int,ft::allocator<ft::treeNode<int>>>,ft::constTreeIterator<int,ft::allocator<ft::treeNode<int>>>,ft::equal_to<int>>
               (treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *first1,
               treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *last1,
               treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *first2)

{
  bool bVar1;
  const_reference x;
  const_reference y;
  type *param_5_local;
  type *param_4_local;
  constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *first2_local;
  constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *last1_local;
  constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *first1_local;
  
  while( true ) {
    bVar1 = operator!=(first1,last1);
    if (!bVar1) {
      return true;
    }
    x = constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator*
                  ((constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)first1);
    y = constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator*
                  ((constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)first2);
    bVar1 = equal_to<int>::operator()((equal_to<int> *)((long)&first1_local + 6),x,y);
    if (!bVar1) break;
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++(first1);
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++(first2);
  }
  return false;
}

Assistant:

bool equal(Iterator1 first1, Iterator1 last1, Iterator2 first2, BinaryPredicate pred,
		   typename ft::_void_t<typename ft::iterator_traits<Iterator1>::iterator_category>::type * = 0,
		   typename ft::_void_t<typename ft::iterator_traits<Iterator2>::iterator_category>::type * = 0) {
	while (first1 != last1) {
		if (!pred(*first1, *first2)) return false;
		++first1; ++first2;
	}
	return true;
}